

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdNormalize_rec(char *pStr,char **p,int *pMatches)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char *q_2;
  int pMarks [13];
  int nMarks;
  int *pPerm;
  int i;
  char *q_1;
  char *pOld;
  char *pStore;
  char *q;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  if (**p == '!') {
    *p = *p + 1;
  }
  while( true ) {
    if (((**p < 'A') || (bVar1 = true, 'F' < **p)) && (bVar1 = false, '/' < **p)) {
      bVar1 = **p < ':';
    }
    if (!bVar1) break;
    *p = *p + 1;
  }
  if ((**p == '<') && (pStr[(long)pMatches[(long)*p - (long)pStr] + 1] == '{')) {
    *p = pStr + (long)pMatches[(long)*p - (long)pStr] + 1;
  }
  if ((**p < 'a') || ('z' < **p)) {
    if ((**p == '(') || (**p == '[')) {
      pcVar4 = *p;
      pcVar2 = pStr + pMatches[(long)*p - (long)pStr];
      pMarks[0xb] = 0;
      if ((int)*pcVar2 != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0xe1,"void Dau_DsdNormalize_rec(char *, char **, int *)");
      }
      *p = *p + 1;
      while (*p < pcVar2) {
        lVar3 = (long)pMarks[0xb];
        pMarks[0xb] = pMarks[0xb] + 1;
        pMarks[lVar3 + -2] = (int)*p - (int)pStr;
        Dau_DsdNormalize_rec(pStr,p,pMatches);
        *p = *p + 1;
      }
      pMarks[(long)pMarks[0xb] + -2] = (int)*p - (int)pStr;
      if (*p != pcVar2) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0xe8,"void Dau_DsdNormalize_rec(char *, char **, int *)");
      }
      register0x00000000 = Dau_DsdNormalizePerm(pStr,(int *)&q_2,pMarks[0xb]);
      pOld = Dau_DsdNormalize_rec::pBuffer;
      for (pPerm._4_4_ = 0; pPerm._4_4_ < pMarks[0xb]; pPerm._4_4_ = pPerm._4_4_ + 1) {
        pOld = Dau_DsdNormalizeCopy(pOld,pStr,(int *)&q_2,stack0xffffffffffffffb0[pPerm._4_4_]);
      }
      if (pOld + -0xfbe3b0 != *p + -(long)(pcVar4 + 1)) {
        __assert_fail("pStore - pBuffer == *p - pOld",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0xef,"void Dau_DsdNormalize_rec(char *, char **, int *)");
      }
      memcpy(pcVar4 + 1,Dau_DsdNormalize_rec::pBuffer,(size_t)(pOld + -0xfbe3b0));
    }
    else {
      if ((**p != '<') && (**p != '{')) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x102,"void Dau_DsdNormalize_rec(char *, char **, int *)");
      }
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      if ((int)*pcVar4 != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0xf6,"void Dau_DsdNormalize_rec(char *, char **, int *)");
      }
      if ((**p == '<') && (pcVar4[1] == '{')) {
        *p = pcVar4 + 1;
        Dau_DsdNormalize_rec(pStr,p,pMatches);
      }
      else {
        *p = *p + 1;
        while (*p < pcVar4) {
          Dau_DsdNormalize_rec(pStr,p,pMatches);
          *p = *p + 1;
        }
        if (*p != pcVar4) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0xff,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
      }
    }
  }
  return;
}

Assistant:

void Dau_DsdNormalize_rec( char * pStr, char ** p, int * pMatches )
{
    static char pBuffer[DAU_MAX_STR];
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        char * pStore, * pOld = *p + 1;
        char * q = pStr + pMatches[ *p - pStr ];
        int i, * pPerm, nMarks = 0, pMarks[DAU_MAX_VAR+1];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            pMarks[nMarks++] = *p - pStr;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        }
        pMarks[nMarks] = *p - pStr;
        assert( *p == q );
        // add to buffer in good order
        pPerm = Dau_DsdNormalizePerm( pStr, pMarks, nMarks );
        // copy to the buffer
        pStore = pBuffer;
        for ( i = 0; i < nMarks; i++ )
            pStore = Dau_DsdNormalizeCopy( pStore, pStr, pMarks, pPerm[i] );
        assert( pStore - pBuffer == *p - pOld );
        memcpy( pOld, pBuffer, pStore - pBuffer );
        return;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( (**p == '<') && (*(q+1) == '{') )
        {
            *p = q+1;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
            return;
        }
        for ( (*p)++; *p < q; (*p)++ )
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        assert( *p == q );
        return;
    }
    assert( 0 );
}